

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_ea51c5::Segment::merge(Segment *this,Segment *other)

{
  long lVar1;
  QPoint QVar2;
  Segment *pSVar3;
  int iVar4;
  int iVar5;
  Segment *in_RSI;
  Segment *in_RDI;
  long in_FS_OFFSET;
  Segment *onext;
  Segment *oprev;
  QPoint p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = right(in_RDI);
  iVar5 = right(in_RDI);
  if (iVar5 < iVar4) {
    pSVar3 = in_RSI->next;
    in_RSI->next = in_RDI->next;
    in_RDI->next->prev = in_RSI;
    in_RDI->next = pSVar3;
    in_RDI->next->prev = in_RDI;
  }
  else {
    QVar2 = in_RSI->point;
    pSVar3 = in_RSI->prev;
    in_RSI->point = in_RDI->point;
    in_RSI->prev = in_RDI->prev;
    in_RDI->prev->next = in_RSI;
    in_RDI->point = QVar2;
    in_RDI->prev = pSVar3;
    pSVar3->next = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void merge(Segment &other)
    {
        if (right() <= other.right()) {
            QPoint p = other.point;
            Segment *oprev = other.prev;

            other.point = point;
            other.prev = prev;
            prev->next = &other;

            point = p;
            prev = oprev;
            oprev->next = this;
        } else {
            Segment *onext = other.next;
            other.next = next;
            next->prev = &other;

            next = onext;
            next->prev = this;
        }
    }